

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O0

positionTy * DataRefs::GetViewPos(void)

{
  double dVar1;
  undefined8 uVar2;
  posFlagsTy pVar3;
  undefined2 uVar4;
  undefined8 uVar5;
  bool bVar6;
  positionTy *in_RDI;
  unique_lock<std::recursive_mutex> lock;
  positionTy *this;
  DataRefs *in_stack_ffffffffffffffe0;
  
  this = in_RDI;
  bVar6 = IsXPThread(in_stack_ffffffffffffffe0);
  if (bVar6) {
    memcpy(this,&lastCamPos,0x48);
  }
  else {
    std::unique_lock<std::recursive_mutex>::unique_lock
              ((unique_lock<std::recursive_mutex> *)this,(mutex_type *)&stack0xfffffffffffffff0);
    this->edgeIdx = lastCamPos.edgeIdx;
    uVar2 = lastCamPos._56_8_;
    this->_roll = lastCamPos._roll;
    uVar5 = lastCamPos._56_8_;
    lastCamPos.mergeCount = (int)uVar2;
    lastCamPos.f = SUB82(uVar2,4);
    pVar3 = lastCamPos.f;
    lastCamPos._62_2_ = SUB82(uVar2,6);
    uVar4 = lastCamPos._62_2_;
    this->mergeCount = lastCamPos.mergeCount;
    lastCamPos._56_8_ = uVar5;
    dVar1 = lastCamPos._pitch;
    this->f = pVar3;
    *(undefined2 *)&this->field_0x3e = uVar4;
    this->_head = lastCamPos._head;
    this->_pitch = dVar1;
    dVar1 = lastCamPos._ts;
    this->_alt = lastCamPos._alt;
    this->_ts = dVar1;
    dVar1 = lastCamPos._lon;
    this->_lat = lastCamPos._lat;
    this->_lon = dVar1;
    std::unique_lock<std::recursive_mutex>::unlock((unique_lock<std::recursive_mutex> *)this);
    std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)this);
  }
  return in_RDI;
}

Assistant:

positionTy DataRefs::GetViewPos()
{
    // If in main thread just return latest pos
    if (dataRefs.IsXPThread())
        return lastCamPos;
    else
    {
        // calling from another thread: safely copy the cached value
        std::unique_lock<std::recursive_mutex> lock(mutexDrUpdate);
        positionTy camPos = lastCamPos;
        lock.unlock();
        return camPos;
    }
}